

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

_Bool disconnect_if_dead(connectdata *conn,Curl_easy *data)

{
  _Bool _Var1;
  int iVar2;
  
  if ((conn->send_pipe->size + conn->recv_pipe->size == 0) && (conn->inuse == false)) {
    if ((conn->handler->protocol & 0x40000) == 0) {
      iVar2 = Curl_socket_check(conn->sock[0],-1,-1,0);
      if (iVar2 == 0) {
        return false;
      }
    }
    else {
      _Var1 = Curl_rtsp_connisdead((connectdata *)0x12880e);
      if (!_Var1) goto LAB_001287ca;
    }
    conn->data = data;
    Curl_infof(data,"Connection %ld seems to be dead!\n",conn->connection_id);
    Curl_disconnect(conn,true);
    _Var1 = true;
  }
  else {
LAB_001287ca:
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool disconnect_if_dead(struct connectdata *conn,
                               struct Curl_easy *data)
{
  size_t pipeLen = conn->send_pipe->size + conn->recv_pipe->size;
  if(!pipeLen && !conn->inuse) {
    /* The check for a dead socket makes sense only if there are no
       handles in pipeline and the connection isn't already marked in
       use */
    bool dead;
    if(conn->handler->protocol & CURLPROTO_RTSP)
      /* RTSP is a special case due to RTP interleaving */
      dead = Curl_rtsp_connisdead(conn);
    else
      dead = SocketIsDead(conn->sock[FIRSTSOCKET]);

    if(dead) {
      conn->data = data;
      infof(data, "Connection %ld seems to be dead!\n", conn->connection_id);

      /* disconnect resources */
      Curl_disconnect(conn, /* dead_connection */TRUE);
      return TRUE;
    }
  }
  return FALSE;
}